

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O3

void print(char *msg)

{
  int iVar1;
  uint uVar2;
  SourceFile file;
  Logger local_1018;
  Timestamp local_48;
  string local_40;
  
  if (sznet::g_logLevel < 3) {
    file._8_8_ = 0x17;
    file.m_data = "timerqueue_unittest.cpp";
    sznet::Logger::Logger(&local_1018,file,0x1d);
    iVar1 = (int)&local_1018 + 0xfb0;
    if (5 < (uint)(iVar1 - (int)local_1018.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1018.m_impl.m_stream.m_buffer.m_cur,"time:",5);
      local_1018.m_impl.m_stream.m_buffer.m_cur = local_1018.m_impl.m_stream.m_buffer.m_cur + 5;
    }
    local_48 = sznet::Timestamp::now();
    sznet::Timestamp::toFormattedString_abi_cxx11_(&local_40,&local_48,true);
    uVar2 = iVar1 - (int)local_1018.m_impl.m_stream.m_buffer.m_cur;
    if (local_40._M_string_length < (ulong)(long)(int)uVar2) {
      memcpy(local_1018.m_impl.m_stream.m_buffer.m_cur,local_40._M_dataplus._M_p,
             local_40._M_string_length);
      local_1018.m_impl.m_stream.m_buffer.m_cur =
           local_1018.m_impl.m_stream.m_buffer.m_cur + local_40._M_string_length;
      uVar2 = iVar1 - (int)local_1018.m_impl.m_stream.m_buffer.m_cur;
    }
    if (5 < uVar2) {
      builtin_strncpy(local_1018.m_impl.m_stream.m_buffer.m_cur," msg:",5);
      local_1018.m_impl.m_stream.m_buffer.m_cur = local_1018.m_impl.m_stream.m_buffer.m_cur + 5;
    }
    sznet::LogStream::operator<<(&local_1018.m_impl.m_stream,msg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    sznet::Logger::~Logger(&local_1018);
  }
  cnt = cnt + 1;
  if (cnt == 0x14) {
    sznet::net::EventLoop::quit(g_timequeue_loop);
  }
  return;
}

Assistant:

void print(const char* msg)
{
	LOG_INFO << "time:" << Timestamp::now().toFormattedString() << " msg:" << msg;
	if (++cnt == 20)
	{
		g_timequeue_loop->quit();
	}
}